

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

basic_ifstream<char,_std::char_traits<char>_> * __thiscall
ev3dev::anon_unknown_20::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>
::operator[](lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__offin;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  iterator i;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  int __fdout;
  _List_const_iterator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>
  in_stack_ffffffffffffffc8;
  iterator local_30;
  _List_const_iterator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>
  local_28;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node = (_List_node_base *)find(in_stack_ffffffffffffffc8._M_node,in_RDI);
  __fdout = (int)in_stack_ffffffffffffffc8._M_node;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
       ::end((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = std::operator!=(local_18,&local_20);
  if (bVar1) {
    in_stack_ffffffffffffffb0 = in_RDI + 8;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
         ::begin((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
                  *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::
    _List_const_iterator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>
    ::_List_const_iterator(&local_28,&local_30);
    __offin = in_RDI + 8;
    std::
    _List_const_iterator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>
    ::_List_const_iterator
              ((_List_const_iterator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>
                *)&stack0xffffffffffffffc8,local_18);
    std::__cxx11::
    list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
    ::splice((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
              *)in_stack_ffffffffffffffb0,(int)local_28._M_node,(__off64_t *)__offin,__fdout,in_R8,
             in_R9,in_stack_ffffffffffffffa8);
  }
  else {
    while (sVar2 = std::__cxx11::
                   list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
                   ::size((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
                           *)in_stack_ffffffffffffffb0), *(ulong *)in_RDI < sVar2 + 1) {
      std::__cxx11::
      list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
      ::pop_back((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
                  *)in_stack_ffffffffffffffb0);
    }
    std::__cxx11::
    list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ifstream>::item,std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ifstream>::item>>
    ::emplace_front<std::__cxx11::string_const&>
              ((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
                *)in_RDI,in_stack_ffffffffffffffb8);
  }
  pvVar3 = std::__cxx11::
           list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
           ::front((list<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item,_std::allocator<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ifstream<char,_std::char_traits<char>_>_>::item>_>
                    *)in_stack_ffffffffffffffb0);
  return &pvVar3->second;
}

Assistant:

V &operator[] (const K &k) {
            iterator i = find(k);
            if (i != _items.end()) {
                // Found the key, bring the item to the front.
                _items.splice(_items.begin(), _items, i);
            } else {
                // If the cache is full, remove oldest items to make room.
                while (_items.size() + 1 > _size) {
                    _items.pop_back();
                }
                // Insert a new default constructed value for this new key.
                _items.emplace_front(k);
            }
            // The new item is the most recently used.
            return _items.front().second;
        }